

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::VelvetMaterial::VelvetMaterial
          (VelvetMaterial *this,Vec3fa *reflectance,float backScattering,
          Vec3fa *horizonScatteringColor,float horizonScatteringFallOff)

{
  undefined8 uVar1;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  local_48 = backScattering;
  local_44 = horizonScatteringFallOff;
  std::__cxx11::string::string((string *)&local_40,"",&local_49);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_0024b850;
  (this->base).type = 3;
  uVar1 = *(undefined8 *)((long)&reflectance->field_0 + 8);
  *(undefined8 *)&(this->reflectance).field_0 = *(undefined8 *)&reflectance->field_0;
  *(undefined8 *)((long)&(this->reflectance).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&horizonScatteringColor->field_0 + 8);
  *(undefined8 *)&(this->horizonScatteringColor).field_0 =
       *(undefined8 *)&horizonScatteringColor->field_0;
  *(undefined8 *)((long)&(this->horizonScatteringColor).field_0 + 8) = uVar1;
  this->backScattering = local_48;
  this->horizonScatteringFallOff = local_44;
  return;
}

Assistant:

VelvetMaterial (const Vec3fa& reflectance, const float backScattering, const Vec3fa& horizonScatteringColor, const float horizonScatteringFallOff)
      : base(MATERIAL_VELVET), reflectance(reflectance), horizonScatteringColor(horizonScatteringColor), backScattering(backScattering), horizonScatteringFallOff(horizonScatteringFallOff) {}